

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin_manager.c
# Opt level: O1

void plugin_manager_iterate
               (plugin_manager manager,_func_int_plugin_manager_plugin_void_ptr *iterator,void *data
               )

{
  plugin_manager_iterate_cb_type args;
  plugin_manager local_18;
  _func_int_plugin_manager_plugin_void_ptr *local_10;
  void *local_8;
  
  if (iterator != (_func_int_plugin_manager_plugin_void_ptr *)0x0) {
    local_18 = manager;
    local_10 = iterator;
    local_8 = data;
    set_iterate(manager->plugins,plugin_manager_iterate_cb,&local_18);
  }
  return;
}

Assistant:

void plugin_manager_iterate(plugin_manager manager, int (*iterator)(plugin_manager, plugin, void *), void *data)
{
	if (iterator == NULL)
	{
		return;
	}

	struct plugin_manager_iterate_cb_type args = {
		manager,
		iterator,
		data
	};

	set_iterate(manager->plugins, &plugin_manager_iterate_cb, (void *)&args);
}